

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall
soplex::
DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
::reSize(DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
         *this,int newsize)

{
  if (this->themax < newsize) {
    reMax(this,(int)((double)newsize * this->memFactor),newsize);
    return;
  }
  if (-1 < newsize) {
    this->thesize = newsize;
    return;
  }
  this->thesize = 0;
  return;
}

Assistant:

void reSize(int newsize)
   {
      assert(memFactor >= 1);

      if(newsize > themax)
         reMax(int(memFactor * newsize), newsize);
      else if(newsize < 0)
         thesize = 0;
      else
         thesize = newsize;
   }